

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZXBigInteger.h
# Opt level: O0

BigInteger * __thiscall ZXing::BigInteger::operator+=(BigInteger *this,BigInteger *a)

{
  bool bVar1;
  BigInteger *in_RSI;
  BigInteger *in_RDI;
  BigInteger *unaff_retaddr;
  BigInteger *b;
  
  b = in_RDI;
  bVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::empty
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)unaff_retaddr);
  if (bVar1) {
    operator=(in_RSI,in_RDI);
  }
  else {
    Add(unaff_retaddr,b,in_RSI);
  }
  return in_RDI;
}

Assistant:

BigInteger& operator+=(BigInteger&& a) {
		if (mag.empty())
			*this = std::move(a);
		else
			Add(*this, a, *this);
		return *this;
	}